

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

EventLogEntry * __thiscall
TTD::EventLog::RecordExternalCallEvent
          (EventLog *this,JavascriptFunction *func,int32 rootDepth,Arguments *args,
          bool checkExceptions)

{
  EventLogEntry *evt;
  undefined7 in_register_00000081;
  ExternalCallEventLogEntry *local_40;
  ExternalCallEventLogEntry *ecEvent;
  
  ecEvent._4_4_ = (undefined4)CONCAT71(in_register_00000081,checkExceptions);
  local_40 = (ExternalCallEventLogEntry *)0x0;
  evt = RecordGetInitializedEvent<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                  (this,&local_40);
  evt->ResultStatus = 0;
  NSLogEvents::ExternalCallEventLogEntry_ProcessArgs
            (evt,rootDepth,func,args,SUB41(ecEvent._4_4_,0),&this->m_eventSlabAllocator);
  NSLogEvents::ExternalCallEventLogEntry_ProcessDiagInfoPre(evt,func,&this->m_eventSlabAllocator);
  return evt;
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordExternalCallEvent(Js::JavascriptFunction* func, int32 rootDepth, const Js::Arguments& args, bool checkExceptions)
    {
        NSLogEvents::ExternalCallEventLogEntry* ecEvent = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::ExternalCallEventLogEntry, NSLogEvents::EventKind::ExternalCallTag>(&ecEvent);

        //We never fail with an exception (instead we set the HasRecordedException in script context)
        evt->ResultStatus = 0;

        NSLogEvents::ExternalCallEventLogEntry_ProcessArgs(evt, rootDepth, func, args, checkExceptions, this->m_eventSlabAllocator);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        NSLogEvents::ExternalCallEventLogEntry_ProcessDiagInfoPre(evt, func, this->m_eventSlabAllocator);
#endif

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteCall(func, true, args.Info.Count, args.Values, this->GetLastEventTime());
#endif

        return evt;
    }